

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O0

void helics::fileops::replaceIfMember<bool>(value *element,string *key,bool *loc)

{
  bool bVar1;
  enable_if_t<detail::is_exact_toml_type<bool,_basic_value<type_config>_>::value,_bool> *peVar2;
  byte *in_RDX;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  basic_value<toml::type_config> *this;
  basic_value<toml::type_config> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_value<toml::type_config> *in_stack_fffffffffffffe68;
  basic_value<toml::type_config> *in_stack_fffffffffffffe70;
  basic_value<toml::type_config> local_e0;
  byte *local_18;
  
  this = &local_e0;
  local_18 = in_RDX;
  toml::basic_value<toml::type_config>::basic_value(this);
  toml::find_or<toml::type_config,std::__cxx11::string>
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x28b9a4)
  ;
  if (!bVar1) {
    peVar2 = toml::get<bool,toml::type_config>(this);
    *local_18 = *peVar2 & 1;
  }
  toml::basic_value<toml::type_config>::~basic_value(this);
  toml::basic_value<toml::type_config>::~basic_value(this);
  return;
}

Assistant:

inline void replaceIfMember(const toml::value& element, const std::string& key, X& loc)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        loc = toml::get<X>(val);
    }
}